

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager_worker.c
# Opt level: O1

apx_error_t
apx_fileManagerWorker_create
          (apx_fileManagerWorker_t *self,apx_fileManagerShared_t *shared,apx_mode_t mode)

{
  adt_buf_err_t aVar1;
  apx_error_t aVar2;
  
  if (self == (apx_fileManagerWorker_t *)0x0) {
    aVar2 = 1;
  }
  else {
    aVar1 = adt_rbfh_create(&self->queue,' ');
    aVar2 = 2;
    if (aVar1 == '\0') {
      self->mode = mode;
      self->shared = shared;
      self->worker_thread_valid = false;
      aVar2 = 0;
      pthread_mutex_init((pthread_mutex_t *)&self->mutex,(pthread_mutexattr_t *)0x0);
      pthread_spin_init(&self->queue_lock,0);
      sem_init((sem_t *)&self->semaphore,0,0);
      self->worker_thread = 0;
    }
  }
  return aVar2;
}

Assistant:

apx_error_t apx_fileManagerWorker_create(apx_fileManagerWorker_t* self, apx_fileManagerShared_t* shared, apx_mode_t mode)
{
   if (self != NULL)
   {
      adt_buf_err_t buf_result = adt_rbfh_create(&self->queue, (uint8_t) APX_COMMAND_SIZE);
      if (buf_result != BUF_E_OK)
      {
         return APX_MEM_ERROR;
      }
      self->mode = mode;
      self->shared = shared;
      self->worker_thread_valid = false;
      MUTEX_INIT(self->mutex);
      (void)SPINLOCK_INIT(self->queue_lock);
      SEMAPHORE_CREATE(self->semaphore);
#ifdef _WIN32
      self->worker_thread = INVALID_HANDLE_VALUE;
      self->worker_thread_id = 0u;
#else
      self->worker_thread = 0;
#endif
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}